

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P)

{
  mbedtls_mpi *pmVar1;
  int iVar2;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  mbedtls_mpi S;
  mbedtls_mpi T;
  mbedtls_mpi U;
  mbedtls_mpi M;
  mbedtls_mpi mStack_98;
  mbedtls_mpi local_80;
  mbedtls_mpi local_68;
  mbedtls_mpi local_50;
  mbedtls_mpi *local_38;
  
  dbl_count = dbl_count + 1;
  mbedtls_mpi_init(&local_50);
  mbedtls_mpi_init(&mStack_98);
  mbedtls_mpi_init(&local_80);
  mbedtls_mpi_init(&local_68);
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    iVar2 = mbedtls_mpi_mul_mpi(&mStack_98,&P->Z,&P->Z);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(&mStack_98,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      iVar2 = mbedtls_mpi_add_mpi(&local_80,&P->X,&mStack_98);
      if (iVar2 == 0) {
        pmVar1 = &grp->P;
        do {
          iVar2 = mbedtls_mpi_cmp_mpi(&local_80,pmVar1);
          if (iVar2 < 0) {
            iVar2 = mbedtls_mpi_sub_mpi(&local_68,&P->X,&mStack_98);
            if (iVar2 == 0) {
              goto LAB_0011e486;
            }
            break;
          }
          iVar2 = mbedtls_mpi_sub_abs(&local_80,&local_80,pmVar1);
        } while (iVar2 == 0);
      }
    }
  }
  else {
    iVar2 = mbedtls_mpi_mul_mpi(&mStack_98,&P->X,&P->X);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(&mStack_98,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      iVar2 = mbedtls_mpi_mul_int(&local_50,&mStack_98,3);
      if (iVar2 == 0) {
        local_38 = &grp->A;
        do {
          iVar2 = mbedtls_mpi_cmp_mpi(&local_50,&grp->P);
          pmVar1 = local_38;
          if (iVar2 < 0) {
            iVar2 = mbedtls_mpi_cmp_int(local_38,0);
            if (iVar2 == 0) goto LAB_0011e2be;
            iVar2 = mbedtls_mpi_mul_mpi(&mStack_98,&P->Z,&P->Z);
            if ((iVar2 == 0) && (iVar2 = ecp_modp(&mStack_98,grp), iVar2 == 0)) {
              mul_count = mul_count + 1;
              iVar2 = mbedtls_mpi_mul_mod(grp,&local_80,&mStack_98,&mStack_98);
              if ((iVar2 == 0) &&
                 ((iVar2 = mbedtls_mpi_mul_mod(grp,&mStack_98,&local_80,pmVar1), iVar2 == 0 &&
                  (iVar2 = mbedtls_mpi_add_mod(grp,&local_50,&local_50,&mStack_98), iVar2 == 0)))) {
LAB_0011e2be:
                pmVar1 = &P->Y;
                iVar2 = mbedtls_mpi_mul_mod(grp,&local_80,pmVar1,pmVar1);
                if (((iVar2 == 0) &&
                    (((iVar2 = mbedtls_mpi_shift_l_mod(grp,&local_80,count), iVar2 == 0 &&
                      (iVar2 = mbedtls_mpi_mul_mod(grp,&mStack_98,&P->X,&local_80), iVar2 == 0)) &&
                     (iVar2 = mbedtls_mpi_shift_l_mod(grp,&mStack_98,count_00), iVar2 == 0)))) &&
                   (((((iVar2 = mbedtls_mpi_mul_mod(grp,&local_68,&local_80,&local_80), iVar2 == 0
                       && (iVar2 = mbedtls_mpi_shift_l_mod(grp,&local_68,count_01), iVar2 == 0)) &&
                      ((iVar2 = mbedtls_mpi_mul_mod(grp,&local_80,&local_50,&local_50), iVar2 == 0
                       && ((iVar2 = mbedtls_mpi_sub_mod(grp,&local_80,&local_80,&mStack_98),
                           iVar2 == 0 &&
                           (iVar2 = mbedtls_mpi_sub_mod(grp,&local_80,&local_80,&mStack_98),
                           iVar2 == 0)))))) &&
                     (iVar2 = mbedtls_mpi_sub_mod(grp,&mStack_98,&mStack_98,&local_80), iVar2 == 0))
                    && (((((iVar2 = mbedtls_mpi_mul_mod(grp,&mStack_98,&mStack_98,&local_50),
                           iVar2 == 0 &&
                           (iVar2 = mbedtls_mpi_sub_mod(grp,&mStack_98,&mStack_98,&local_68),
                           iVar2 == 0)) &&
                          (iVar2 = mbedtls_mpi_mul_mod(grp,&local_68,pmVar1,&P->Z), iVar2 == 0)) &&
                         ((iVar2 = mbedtls_mpi_shift_l_mod(grp,&local_68,count_02), iVar2 == 0 &&
                          (iVar2 = mbedtls_mpi_copy(&R->X,&local_80), iVar2 == 0)))) &&
                        (iVar2 = mbedtls_mpi_copy(&R->Y,&mStack_98), iVar2 == 0)))))) {
                  iVar2 = mbedtls_mpi_copy(&R->Z,&local_68);
                }
              }
            }
            break;
          }
          iVar2 = mbedtls_mpi_sub_abs(&local_50,&local_50,&grp->P);
        } while (iVar2 == 0);
      }
    }
  }
LAB_0011e1bc:
  mbedtls_mpi_free(&local_50);
  mbedtls_mpi_free(&mStack_98);
  mbedtls_mpi_free(&local_80);
  mbedtls_mpi_free(&local_68);
  return iVar2;
  while (iVar2 = mbedtls_mpi_add_mpi(&local_68,&local_68,pmVar1), iVar2 == 0) {
LAB_0011e486:
    if ((-1 < local_68.s) || (iVar2 = mbedtls_mpi_cmp_int(&local_68,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_mul_mod(grp,&mStack_98,&local_80,&local_68);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_mul_int(&local_50,&mStack_98,3), iVar2 == 0)) {
        goto LAB_0011e4f0;
      }
      break;
    }
  }
  goto LAB_0011e1bc;
  while (iVar2 = mbedtls_mpi_sub_abs(&local_50,&local_50,pmVar1), iVar2 == 0) {
LAB_0011e4f0:
    iVar2 = mbedtls_mpi_cmp_mpi(&local_50,pmVar1);
    if (iVar2 < 0) goto LAB_0011e2be;
  }
  goto LAB_0011e1bc;
}

Assistant:

static int ecp_double_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                           const mbedtls_ecp_point *P )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi M, S, T, U;

#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

#if defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_double_jac( grp, R, P ) );
#endif /* MBEDTLS_ECP_DOUBLE_JAC_ALT */

    mbedtls_mpi_init( &M ); mbedtls_mpi_init( &S ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &U );

    /* Special case for A = -3 */
    if( grp->A.p == NULL )
    {
        /* M = 3(X + Z^2)(X - Z^2) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->Z,  &P->Z   ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &T,  &P->X,  &S      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &U,  &P->X,  &S      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &T,     &U      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );
    }
    else
    {
        /* M = 3.X^2 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->X,  &P->X   ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );

        /* Optimize away for "koblitz" curves with A = 0 */
        if( mbedtls_mpi_cmp_int( &grp->A, 0 ) != 0 )
        {
            /* M += A.Z^4 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->Z,  &P->Z   ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &S,     &S      ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &T,     &grp->A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &M,  &M,     &S      ) );
        }
    }

    /* S = 4.X.Y^2 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &P->Y,  &P->Y   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &T,  1               ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->X,  &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &S,  1               ) );

    /* U = 8.Y^4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &U,  &T,     &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &U,  1               ) );

    /* T = M^2 - 2.S */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &M,     &M      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T,  &T,     &S      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T,  &T,     &S      ) );

    /* S = M(S - T) - U */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &S,  &S,     &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &S,     &M      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &S,  &S,     &U      ) );

    /* U = 2.Y.Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &U,  &P->Y,  &P->Z   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &U,  1               ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &T ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &S ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &U ) );

cleanup:
    mbedtls_mpi_free( &M ); mbedtls_mpi_free( &S ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &U );

    return( ret );
}